

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_updateGradient
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this)

{
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_48;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
  local_38;
  
  local_48 = MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&this->_AtA,
                        (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&this->_x);
  MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-
            (&local_38,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->_Atb,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
              *)&local_48);
  internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const>>
            (&this->_w,&local_38);
  return;
}

Assistant:

void _updateGradient() {
    // w <- A^T b - A^TA x
    _w = _Atb - _AtA*_x;
#ifdef EIGEN3_NNLS_DEBUG
    std::cerr << "NNLS(): Gradient at (" << _x.transpose()
              << ") = (" << _w.transpose() << ")" << std::endl;
#endif
  }